

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2lax_polygon_shape.cc
# Opt level: O1

Edge * __thiscall
S2LaxPolygonShape::edge(Edge *__return_storage_ptr__,S2LaxPolygonShape *this,int e0)

{
  anon_union_8_2_29389cd6_for_S2LaxPolygonShape_4 *paVar1;
  uint *puVar2;
  uint uVar3;
  Vector3<double> *pVVar4;
  VType VVar5;
  uint uVar6;
  long lVar7;
  uint *puVar8;
  anon_union_8_2_29389cd6_for_S2LaxPolygonShape_4 *paVar9;
  ulong uVar10;
  uint *puVar11;
  ulong uVar12;
  ulong uVar13;
  S2LogMessage SStack_18;
  
  lVar7 = (long)*(int *)&(this->super_S2Shape).field_0xc;
  paVar1 = &this->field_2;
  paVar9 = (anon_union_8_2_29389cd6_for_S2LaxPolygonShape_4 *)
           ((this->field_2).cumulative_vertices_ + lVar7);
  if (lVar7 < 2) {
    paVar9 = paVar1;
  }
  if (e0 < paVar9->num_vertices_) {
    uVar6 = e0 + 1;
    uVar3 = *(uint *)&(this->super_S2Shape).field_0xc;
    uVar10 = (ulong)uVar3;
    if (uVar10 == 1) {
      if (uVar6 == paVar1->num_vertices_) {
        uVar6 = 0;
      }
    }
    else {
      puVar11 = paVar1->cumulative_vertices_;
      if ((int)uVar3 < 0xd) {
        do {
          puVar8 = puVar11 + 1;
          puVar2 = puVar11 + 1;
          puVar11 = puVar8;
        } while (*puVar2 <= (uint)e0);
      }
      else {
        puVar8 = paVar1->cumulative_vertices_ + 1;
        do {
          uVar12 = uVar10 >> 1;
          uVar13 = ~uVar12 + uVar10;
          uVar10 = uVar12;
          if (puVar8[uVar12] < uVar6) {
            puVar8 = puVar8 + uVar12 + 1;
            uVar10 = uVar13;
          }
        } while (0 < (long)uVar10);
      }
      if (uVar6 == *puVar8) {
        uVar6 = puVar8[-1];
      }
    }
    pVVar4 = (this->vertices_)._M_t.
             super___uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_>._M_t.
             super__Tuple_impl<0UL,_Vector3<double>_*,_std::default_delete<Vector3<double>[]>_>.
             super__Head_base<0UL,_Vector3<double>_*,_false>._M_head_impl;
    (__return_storage_ptr__->v0).c_[2] = pVVar4[e0].c_[2];
    VVar5 = pVVar4[e0].c_[1];
    (__return_storage_ptr__->v0).c_[0] = pVVar4[e0].c_[0];
    (__return_storage_ptr__->v0).c_[1] = VVar5;
    VVar5 = pVVar4[(int)uVar6].c_[1];
    (__return_storage_ptr__->v1).c_[0] = pVVar4[(int)uVar6].c_[0];
    (__return_storage_ptr__->v1).c_[1] = VVar5;
    (__return_storage_ptr__->v1).c_[2] = pVVar4[(int)uVar6].c_[2];
    return __return_storage_ptr__;
  }
  S2LogMessage::S2LogMessage
            (&SStack_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2lax_polygon_shape.cc"
             ,0xb1,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (SStack_18.stream_,"Check failed: (e0) < (num_edges()) ",0x23);
  abort();
}

Assistant:

S2Shape::Edge S2LaxPolygonShape::edge(int e0) const {
  S2_DCHECK_LT(e0, num_edges());
  int e1 = e0 + 1;
  if (num_loops() == 1) {
    if (e1 == num_vertices_) { e1 = 0; }
  } else {
    // Find the index of the first vertex of the loop following this one.
    const int kMaxLinearSearchLoops = 12;  // From benchmarks.
    uint32* next = cumulative_vertices_ + 1;
    if (num_loops() <= kMaxLinearSearchLoops) {
      while (*next <= e0) ++next;
    } else {
      next = std::lower_bound(next, next + num_loops(), e1);
    }
    // Wrap around to the first vertex of the loop if necessary.
    if (e1 == *next) { e1 = next[-1]; }
  }
  return Edge(vertices_[e0], vertices_[e1]);
}